

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O3

Instr * __thiscall LowererMDArch::LowerEntryInstr(LowererMDArch *this,EntryInstr *entryInstr)

{
  IRType type;
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  undefined4 *puVar8;
  RegOpnd *pRVar9;
  RegOpnd *pRVar10;
  IndirOpnd *dstOpnd;
  Instr *pIVar11;
  JITTimeFunctionBody *this_00;
  Instr *pIVar12;
  Opnd *pOVar13;
  Opnd *src1Opnd;
  Instr *instr;
  StackSym *sym;
  SymOpnd *dstOpnd_00;
  Instr *pIVar14;
  PragmaInstr *pPVar15;
  undefined8 uVar16;
  uint uVar17;
  uint32 size;
  uint32 size_00;
  uint uVar18;
  RegNum reg;
  ulong uVar19;
  int32 offset;
  int iVar20;
  
  pIVar14 = (entryInstr->super_Instr).m_next;
  if (pIVar14 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x639,"(secondInstr)","Instruction chain broken.");
    if (!bVar3) goto LAB_00646c23;
    *puVar8 = 0;
  }
  else {
    puVar8 = (undefined4 *)__tls_get_addr();
  }
  iVar7 = 0;
  pRVar9 = IR::RegOpnd::New((StackSym *)0x0,RegRSP,TyInt64,this->m_func);
  uVar19 = 1;
  offset = 0;
  do {
    bVar3 = LinearScan::IsCalleeSaved((RegNum)uVar19);
    if ((bVar3) &&
       ((BVar6 = Func::HasTry(this->m_func), BVar6 != 0 ||
        (pFVar1 = this->m_func, BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar19),
        ((pFVar1->m_regsUsed).word >> (uVar19 & 0x3f) & 1) != 0)))) {
      type = RegTypes[uVar19];
      pRVar10 = IR::RegOpnd::New((StackSym *)0x0,(RegNum)uVar19,type,this->m_func);
      if (type != TyInt64) {
        if (type == TyFloat64) {
          dstOpnd = IR::IndirOpnd::New(pRVar9,offset,TyFloat64,this->m_func,false);
          pIVar11 = IR::Instr::New(MOVAPS,&dstOpnd->super_Opnd,&pRVar10->super_Opnd,this->m_func);
          offset = offset + 0x10;
          IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar11);
          goto LAB_0064669d;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x658,"(type == TyInt64)","type == TyInt64");
        if (!bVar3) goto LAB_00646c23;
        *puVar8 = 0;
      }
      pIVar11 = IR::Instr::New(PUSH,this->m_func);
      if (pIVar11->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar3) goto LAB_00646c23;
        *puVar8 = 0;
      }
      pFVar1 = pIVar11->m_func;
      if ((pRVar10->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar3) goto LAB_00646c23;
        *puVar8 = 0;
      }
      bVar4 = (pRVar10->super_Opnd).field_0xb;
      if ((bVar4 & 2) != 0) {
        pRVar10 = (RegOpnd *)IR::Opnd::Copy(&pRVar10->super_Opnd,pFVar1);
        bVar4 = (pRVar10->super_Opnd).field_0xb;
      }
      (pRVar10->super_Opnd).field_0xb = bVar4 | 2;
      pIVar11->m_src1 = &pRVar10->super_Opnd;
      IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar11);
      iVar7 = iVar7 + 8;
    }
LAB_0064669d:
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0x21);
  uVar17 = this->m_func->m_argSlotsForFunctionsCalled;
  bVar3 = Lowerer::IsArgSaveRequired(this->m_func);
  iVar20 = 8;
  if (bVar3) {
    uVar18 = 6;
    if (6 < uVar17) {
      uVar18 = uVar17;
    }
    iVar20 = uVar18 * 8 + 8;
  }
  pFVar1 = this->m_func;
  uVar17 = pFVar1->m_localStackHeight + 7U & 0xfffffff8;
  uVar18 = pFVar1->maxInlineeArgOutSize + uVar17 + 8;
  uVar17 = offset + pFVar1->maxInlineeArgOutSize + uVar17 + 0x17 & 0xfffffff0;
  if (offset == 0) {
    uVar17 = uVar18;
  }
  pFVar1->m_localStackHeight = uVar18;
  uVar18 = iVar7 + iVar20 + uVar17;
  if ((uVar18 & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x688,"(0 == (totalStackSize % 8))","Stack should always be 8 byte aligned")
    ;
    if (!bVar3) goto LAB_00646c23;
    *puVar8 = 0;
  }
  bVar3 = (uVar18 & 0xf) != 0;
  size = iVar20 + (uint)bVar3 * 8;
  if ((offset != 0) && ((iVar7 + size + 0xf & 0xfffffff0) != size + iVar7)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x68e,
                       "(xmmOffset == 0 || ::Math::Align(stackArgsSize + savedRegSize, static_cast<uint32>(MachDouble * 2)) == stackArgsSize + savedRegSize)"
                       ,
                       "xmmOffset == 0 || ::Math::Align(stackArgsSize + savedRegSize, static_cast<uint32>(MachDouble * 2)) == stackArgsSize + savedRegSize"
                      );
    if (!bVar5) goto LAB_00646c23;
    *puVar8 = 0;
  }
  if (0x100000 < (uint)bVar3 * 8 + uVar18) {
    uVar16 = __cxa_allocate_exception(1);
    __cxa_throw(uVar16,&Js::OperationAbortedException::typeinfo,0);
  }
  bVar3 = Func::HasInlinee(this->m_func);
  if (bVar3) {
    JITOutput::SetFrameHeight(&this->m_func->m_output,this->m_func->m_localStackHeight);
  }
  pFVar1 = this->m_func;
  pFVar1->m_argsSize = size;
  pFVar1->m_savedRegSize = iVar7;
  pFVar1->m_spillSize = uVar17;
  if (pIVar14 == (entryInstr->super_Instr).m_next) {
    pIVar11 = pIVar14->m_prev;
    size_00 = size + uVar17;
LAB_00646866:
    GenerateStackAllocation(this,pIVar11,size_00);
  }
  else {
    GenerateStackAllocation(this,pIVar14->m_prev,size);
    pIVar11 = &entryInstr->super_Instr;
    size_00 = uVar17;
    if (uVar17 != 0) goto LAB_00646866;
  }
  pIVar11 = pIVar14->m_prev;
  if (pIVar11 == &entryInstr->super_Instr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x6bc,"(lastPrologInstr != entryInstr)","lastPrologInstr != entryInstr");
    if (!bVar3) goto LAB_00646c23;
    *puVar8 = 0;
  }
  bVar3 = Func::HasArgumentSlot(this->m_func);
  if (bVar3) {
    bVar3 = Func::IsStackArgsEnabled(this->m_func);
    if ((!bVar3) && (bVar3 = Func::IsJitInDebugMode(this->m_func), !bVar3)) {
      this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      bVar3 = JITTimeFunctionBody::IsInlineApplyDisabled(this_00);
      if (!bVar3) goto LAB_006468f7;
    }
LAB_0064694f:
    pRVar9 = IR::RegOpnd::New((StackSym *)0x0,RegRAX,TyUint32,this->m_func);
    pIVar12 = IR::Instr::New(XOR,&pRVar9->super_Opnd,&pRVar9->super_Opnd,&pRVar9->super_Opnd,
                             this->m_func);
    IR::Instr::InsertAfter(pIVar14->m_prev,pIVar12);
    pOVar13 = LowererMD::CreateStackArgumentsSlotOpnd(this->m_func);
    src1Opnd = IR::Opnd::UseWithNewType(&pRVar9->super_Opnd,TyInt64,this->m_func);
    instr = IR::Instr::New(MOV,pOVar13,src1Opnd,this->m_func);
    IR::Instr::InsertAfter(pIVar14->m_prev,instr);
    bVar3 = Func::HasInlinee(this->m_func);
    if (bVar3) {
      if (pIVar12 == (Instr *)0x0) {
LAB_006469dc:
        pRVar9 = IR::RegOpnd::New((StackSym *)0x0,RegRAX,TyUint32,this->m_func);
        pIVar12 = IR::Instr::New(XOR,&pRVar9->super_Opnd,&pRVar9->super_Opnd,&pRVar9->super_Opnd,
                                 this->m_func);
        IR::Instr::InsertAfter(pIVar14->m_prev,pIVar12);
      }
      sym = SymTable::GetArgSlotSym(this->m_func->m_symTable,0xffff);
      sym->field_0x19 = sym->field_0x19 | 0x40;
      sym->m_offset = 0;
      dstOpnd_00 = IR::SymOpnd::New(&sym->super_Sym,0,TyInt64,this->m_func);
      pIVar14 = pIVar14->m_prev;
      pOVar13 = IR::Opnd::UseWithNewType(&pRVar9->super_Opnd,TyInt64,this->m_func);
      pIVar12 = IR::Instr::New(MOV,&dstOpnd_00->super_Opnd,pOVar13,this->m_func);
      IR::Instr::InsertAfter(pIVar14,pIVar12);
    }
  }
  else {
LAB_006468f7:
    bVar3 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutFlag);
    if ((((bVar3) ||
         (bVar3 = Js::ConfigFlagsTable::IsEnabled
                            ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutAtEveryLineFlag),
         bVar3)) ||
        (bVar3 = Js::ConfigFlagsTable::IsEnabled
                           ((ConfigFlagsTable *)&Js::Configuration::Global,
                            BailOutAtEveryByteCodeFlag), bVar3)) ||
       (bVar3 = Js::ConfigFlagsTable::IsEnabled
                          ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutByteCodeFlag),
       bVar3)) goto LAB_0064694f;
    bVar3 = Func::HasInlinee(this->m_func);
    if (bVar3) goto LAB_006469dc;
  }
  pRVar9 = IR::RegOpnd::New((StackSym *)0x0,RegRBP,TyInt64,this->m_func);
  pRVar10 = IR::RegOpnd::New((StackSym *)0x0,RegRSP,TyInt64,this->m_func);
  pIVar14 = IR::Instr::New(MOV,&pRVar9->super_Opnd,&pRVar10->super_Opnd,this->m_func);
  IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar14);
  pIVar14 = IR::Instr::New(PUSH,this->m_func);
  if (pIVar14->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_00646c23;
    *puVar8 = 0;
  }
  pFVar1 = pIVar14->m_func;
  if ((pRVar9->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_00646c23:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  bVar4 = (pRVar9->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    pRVar9 = (RegOpnd *)IR::Opnd::Copy(&pRVar9->super_Opnd,pFVar1);
    bVar4 = (pRVar9->super_Opnd).field_0xb;
  }
  (pRVar9->super_Opnd).field_0xb = bVar4 | 2;
  pIVar14->m_src1 = &pRVar9->super_Opnd;
  IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar14);
  pPVar15 = IR::PragmaInstr::New(PrologStart,0,this->m_func);
  IR::Instr::InsertBefore(pIVar14,&pPVar15->super_Instr);
  pPVar15 = IR::PragmaInstr::New(PrologEnd,0,this->m_func);
  IR::Instr::InsertAfter(pIVar11,&pPVar15->super_Instr);
  GeneratePrologueStackProbe(this,&entryInstr->super_Instr,(ulong)(size + iVar7 + uVar17 + 0x1b90));
  return &entryInstr->super_Instr;
}

Assistant:

IR::Instr *
LowererMDArch::LowerEntryInstr(IR::EntryInstr * entryInstr)
{
    /*
     * push   rbp
     * mov    rbp,                       rsp
     * sub    rsp,                       localVariablesHeight + floatCalleeSavedRegsSize
     * movsdx qword ptr [rsp + 0],       xmm6  ------\
     * movsdx qword ptr [rsp + 8],       xmm7        |
     * ...                                           |
     * movsdx qword ptr [rsp + (N * 8)], xmmN        |- Callee saved registers.
     * push   rsi                                    |
     * ...                                           |
     * push   rbx                              ------/
     * sub    rsp,                       ArgumentsBacking
     */

    uint savedRegSize           = 0;
    IR::Instr *firstPrologInstr = nullptr;
    IR::Instr *lastPrologInstr  = nullptr;

    // PUSH used callee-saved registers.
    IR::Instr *secondInstr      = entryInstr->m_next;
    AssertMsg(secondInstr, "Instruction chain broken.");

    IR::RegOpnd *stackPointer   = IR::RegOpnd::New(nullptr, GetRegStackPointer(), TyMachReg, this->m_func);
    unsigned     xmmOffset      = 0;

    // PDATA doesn't seem to like two consecutive "SUB RSP, size" instructions. Temporarily save and
    // restore RBX always so that the pattern doesn't occur in the prolog.
    for (RegNum reg = (RegNum)(RegNOREG + 1); reg < RegNumCount; reg = (RegNum)(reg + 1))
    {
        if (LinearScan::IsCalleeSaved(reg) && (this->m_func->HasTry() || this->m_func->m_regsUsed.Test(reg)))
        {
            IRType       type      = RegTypes[reg];
            IR::RegOpnd *regOpnd   = IR::RegOpnd::New(nullptr, reg, type, this->m_func);

            if (type == TyFloat64)
            {
                IR::Instr *saveInstr = IR::Instr::New(Js::OpCode::MOVAPS,
                                                      IR::IndirOpnd::New(stackPointer,
                                                                         xmmOffset,
                                                                         type,
                                                                         this->m_func),
                                                      regOpnd,
                                                      this->m_func);

                xmmOffset += (MachDouble * 2);
                entryInstr->InsertAfter(saveInstr);

                m_func->m_prologEncoder.RecordXmmRegSave();
            }
            else
            {
                Assert(type == TyInt64);

                IR::Instr *pushInstr = IR::Instr::New(Js::OpCode::PUSH, this->m_func);
                pushInstr->SetSrc1(regOpnd);
                entryInstr->InsertAfter(pushInstr);

                m_func->m_prologEncoder.RecordNonVolRegSave();
                savedRegSize += MachPtr;
            }
        }
    }
    //
    // Now that we know the exact stack size, lets fix it for alignment
    // The stack on entry would be aligned. VC++ recommends that the stack
    // should always be 16 byte aligned.
    //
    uint32 argSlotsForFunctionsCalled = this->m_func->m_argSlotsForFunctionsCalled;

    if (Lowerer::IsArgSaveRequired(this->m_func))
    {
        if (argSlotsForFunctionsCalled < IntArgRegsCount)
            argSlotsForFunctionsCalled = IntArgRegsCount;
    }
    else
    {
        argSlotsForFunctionsCalled = 0;
    }

    uint32 stackArgsSize    = MachPtr * (argSlotsForFunctionsCalled + 1);

    this->m_func->m_localStackHeight = Math::Align<int32>(this->m_func->m_localStackHeight, 8);

    // Allocate the inlined arg out stack in the locals. Allocate an additional slot so that
    // we can unconditionally clear the first slot past the current frame.
    this->m_func->m_localStackHeight += m_func->GetMaxInlineeArgOutSize() + MachPtr;

    uint32 stackLocalsSize  = this->m_func->m_localStackHeight;
    if(xmmOffset != 0)
    {
        // Xmm registers need to be saved to 16-byte-aligned addresses. The stack locals size is aligned here and the total
        // size will be aligned below, which guarantees that the offset from rsp will be 16-byte-aligned.
        stackLocalsSize = ::Math::Align(stackLocalsSize + xmmOffset, static_cast<uint32>(MachDouble * 2));
    }

    uint32 totalStackSize   = stackLocalsSize +
                              stackArgsSize   +
                              savedRegSize;

    AssertMsg(0 == (totalStackSize % 8), "Stack should always be 8 byte aligned");
    uint32 alignmentPadding = (totalStackSize % 16) ? MachPtr : 0;

    stackArgsSize += alignmentPadding;
    Assert(
        xmmOffset == 0 ||
        ::Math::Align(stackArgsSize + savedRegSize, static_cast<uint32>(MachDouble * 2)) == stackArgsSize + savedRegSize);

    totalStackSize += alignmentPadding;
    if(totalStackSize > (1u << 20)) // 1 MB
    {
        // Total stack size is > 1 MB, let's just bail. There are things that need to be changed to allow using large stack
        // sizes, for instance in the unwind info, the offset to saved xmm registers can be (1 MB - 16) at most for the op-code
        // we're currently using (UWOP_SAVE_XMM128). To support larger offsets, we need to use a FAR version of the op-code.
        throw Js::OperationAbortedException();
    }

    if (m_func->HasInlinee())
    {
        this->m_func->GetJITOutput()->SetFrameHeight(this->m_func->m_localStackHeight);
    }

    //
    // This is the last instruction so should have been emitted before, register saves.
    // But we did not have 'savedRegSize' by then. So we saved secondInstr. We now insert w.r.t that
    // instruction.
    //
    this->m_func->SetArgsSize(stackArgsSize);
    this->m_func->SetSavedRegSize(savedRegSize);
    this->m_func->SetSpillSize(stackLocalsSize);

    if (secondInstr == entryInstr->m_next)
    {
        // There is no register save at all, just combine the stack allocation
        uint combineStackAllocationSize = stackArgsSize + stackLocalsSize;
        this->GenerateStackAllocation(secondInstr->m_prev, combineStackAllocationSize);
        m_func->m_prologEncoder.RecordAlloca(combineStackAllocationSize);
    }
    else
    {
        this->GenerateStackAllocation(secondInstr->m_prev, stackArgsSize);
        m_func->m_prologEncoder.RecordAlloca(stackArgsSize);

        // Allocate frame.
        if (stackLocalsSize)
        {
            this->GenerateStackAllocation(entryInstr, stackLocalsSize);
            m_func->m_prologEncoder.RecordAlloca(stackLocalsSize);
        }
    }

    lastPrologInstr = secondInstr->m_prev;
    Assert(lastPrologInstr != entryInstr);

    // Zero-initialize dedicated arguments slot.
    IR::Instr *movRax0 = nullptr;
    IR::Opnd *raxOpnd = nullptr;

    if ((this->m_func->HasArgumentSlot() &&
            (this->m_func->IsStackArgsEnabled() ||
            this->m_func->IsJitInDebugMode() ||
            // disabling apply inlining leads to explicit load from the zero-inited slot
            this->m_func->GetJITFunctionBody()->IsInlineApplyDisabled()))
#ifdef BAILOUT_INJECTION
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutFlag)
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryLineFlag)
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag)
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutByteCodeFlag)
#endif
        )
    {
        // TODO: Support mov [rbp - n], IMM64
        raxOpnd = IR::RegOpnd::New(nullptr, RegRAX, TyUint32, this->m_func);
        movRax0 = IR::Instr::New(Js::OpCode::XOR, raxOpnd, raxOpnd, raxOpnd, this->m_func);
        secondInstr->m_prev->InsertAfter(movRax0);

        IR::Opnd *opnd = LowererMD::CreateStackArgumentsSlotOpnd(this->m_func);
        IR::Instr *movNullInstr = IR::Instr::New(Js::OpCode::MOV, opnd, raxOpnd->UseWithNewType(TyMachReg, this->m_func), this->m_func);
        secondInstr->m_prev->InsertAfter(movNullInstr);
    }

    // Zero initialize the first inlinee frames argc.
    if (m_func->HasInlinee())
    {
        if(!movRax0)
        {
            raxOpnd = IR::RegOpnd::New(nullptr, RegRAX, TyUint32, this->m_func);
            movRax0 = IR::Instr::New(Js::OpCode::XOR, raxOpnd, raxOpnd, raxOpnd, this->m_func);
            secondInstr->m_prev->InsertAfter(movRax0);
        }

        StackSym *sym           = this->m_func->m_symTable->GetArgSlotSym((Js::ArgSlot)-1);
        sym->m_isInlinedArgSlot = true;
        sym->m_offset           = 0;
        IR::Opnd *dst           = IR::SymOpnd::New(sym, 0, TyMachReg, this->m_func);
        secondInstr->m_prev->InsertAfter(IR::Instr::New(Js::OpCode::MOV,
                                                        dst,
                                                        raxOpnd->UseWithNewType(TyMachReg, this->m_func),
                                                        this->m_func));
    }

    // Generate MOV RBP, RSP
    IR::RegOpnd * rbpOpnd = IR::RegOpnd::New(nullptr, RegRBP, TyMachReg, this->m_func);
    IR::RegOpnd * rspOpnd = IR::RegOpnd::New(nullptr, RegRSP, TyMachReg, this->m_func);

    IR::Instr * movInstr = IR::Instr::New(Js::OpCode::MOV, rbpOpnd, rspOpnd, this->m_func);
    entryInstr->InsertAfter(movInstr);

    // Generate PUSH RBP
    IR::Instr * pushInstr = IR::Instr::New(Js::OpCode::PUSH, this->m_func);
    pushInstr->SetSrc1(rbpOpnd);
    entryInstr->InsertAfter(pushInstr);
    m_func->m_prologEncoder.RecordNonVolRegSave();
    firstPrologInstr = pushInstr;


    //
    // Insert pragmas that tell the prolog encoder the extent of the prolog.
    //
    firstPrologInstr->InsertBefore(IR::PragmaInstr::New(Js::OpCode::PrologStart, 0, m_func));
    lastPrologInstr->InsertAfter(IR::PragmaInstr::New(Js::OpCode::PrologEnd, 0, m_func));

#ifdef _WIN32 // home registers
    //
    // Now store all the arguments in the register in the stack slots
    //
    if (m_func->GetJITFunctionBody()->IsAsmJsMode() && !m_func->IsLoopBody())
    {
        uint16 offset = 2;
        this->MovArgFromReg2Stack(entryInstr, RegRCX, 1);
        for (uint16 i = 0; i < m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetArgCount() && i < 3; i++)
        {
            switch (m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetArgType(i))
            {
            case Js::AsmJsVarType::Int:
                this->MovArgFromReg2Stack(entryInstr, i == 0 ? RegRDX : i == 1 ? RegR8 : RegR9, offset, TyInt32);
                offset++;
                break;
            case Js::AsmJsVarType::Int64:
                this->MovArgFromReg2Stack(entryInstr, i == 0 ? RegRDX : i == 1 ? RegR8 : RegR9, offset, TyInt64);
                offset++;
                break;
            case Js::AsmJsVarType::Float:
                // registers we need are contiguous, so calculate it from XMM1
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TyFloat32);
                offset++;
                break;
            case Js::AsmJsVarType::Double:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TyFloat64);
                offset++;
                break;
            case Js::AsmJsVarType::Float32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128F4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int16x8:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I8);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int8x16:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I16);
                offset += 2;
                break;
            case Js::AsmJsVarType::Uint32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128U4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Uint16x8:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128U8);
                offset += 2;
                break;
            case Js::AsmJsVarType::Uint8x16:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128U16);
                offset += 2;
                break;
            case Js::AsmJsVarType::Bool32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128B4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Bool16x8:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128B8);
                offset += 2;
                break;
            case Js::AsmJsVarType::Bool8x16:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128B16);
                offset += 2;
                break;
            case Js::AsmJsVarType::Float64x2:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128D2);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int64x2:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I2);
                offset += 2;
                break;
            default:
                Assume(UNREACHED);
            }
        }
    }
    else if (argSlotsForFunctionsCalled)
    {
        this->MovArgFromReg2Stack(entryInstr, RegRCX, 1);
        this->MovArgFromReg2Stack(entryInstr, RegRDX, 2);
        this->MovArgFromReg2Stack(entryInstr, RegR8, 3);
        this->MovArgFromReg2Stack(entryInstr, RegR9, 4);
    }
#endif  // _WIN32

    IntConstType frameSize = Js::Constants::MinStackJIT + stackArgsSize + stackLocalsSize + savedRegSize;
    this->GeneratePrologueStackProbe(entryInstr, frameSize);

    return entryInstr;
}